

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_bench.cc
# Opt level: O0

uint64_t __thiscall sfc64::operator()(sfc64 *this)

{
  uint64_t uVar1;
  unsigned_long uVar2;
  uint64_t tmp;
  sfc64 *this_local;
  
  uVar1 = this->m_counter;
  this->m_counter = uVar1 + 1;
  uVar1 = this->m_a + this->m_b + uVar1;
  this->m_a = this->m_b ^ this->m_b >> 0xb;
  this->m_b = this->m_c * 9;
  uVar2 = rotl<unsigned_long>(this,this->m_c,0x18);
  this->m_c = uVar2 + uVar1;
  return uVar1;
}

Assistant:

uint64_t operator()() noexcept {
        auto const tmp = m_a + m_b + m_counter++;
        m_a = m_b ^ (m_b >> right_shift);
        m_b = m_c + (m_c << left_shift);
        m_c = rotl(m_c, rotation) + tmp;
        return tmp;
    }